

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast.cpp
# Opt level: O2

bool duckdb::FromDecimalCast<unsigned_char>
               (Vector *source,Vector *result,idx_t count,CastParameters *parameters)

{
  PhysicalType PVar1;
  InternalException *this;
  uint8_t width;
  uint8_t scale;
  bool bVar2;
  allocator local_51;
  string local_50;
  
  width = DecimalType::GetWidth(&source->type);
  scale = DecimalType::GetScale(&source->type);
  PVar1 = (source->type).physical_type_;
  if (PVar1 == INT128) {
    bVar2 = VectorCastHelpers::
            TemplatedDecimalCast<duckdb::hugeint_t,unsigned_char,duckdb::TryCastFromDecimal>
                      (source,result,count,parameters,width,scale);
    return bVar2;
  }
  if (PVar1 == INT32) {
    bVar2 = VectorCastHelpers::TemplatedDecimalCast<int,unsigned_char,duckdb::TryCastFromDecimal>
                      (source,result,count,parameters,width,scale);
    return bVar2;
  }
  if (PVar1 == INT64) {
    bVar2 = VectorCastHelpers::TemplatedDecimalCast<long,unsigned_char,duckdb::TryCastFromDecimal>
                      (source,result,count,parameters,width,scale);
    return bVar2;
  }
  if (PVar1 == INT16) {
    bVar2 = VectorCastHelpers::TemplatedDecimalCast<short,unsigned_char,duckdb::TryCastFromDecimal>
                      (source,result,count,parameters,width,scale);
    return bVar2;
  }
  this = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_50,"Unimplemented internal type for decimal",&local_51);
  InternalException::InternalException(this,&local_50);
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static bool FromDecimalCast(Vector &source, Vector &result, idx_t count, CastParameters &parameters) {
	auto &source_type = source.GetType();
	auto width = DecimalType::GetWidth(source_type);
	auto scale = DecimalType::GetScale(source_type);
	switch (source_type.InternalType()) {
	case PhysicalType::INT16:
		return VectorCastHelpers::TemplatedDecimalCast<int16_t, T, TryCastFromDecimal>(source, result, count,
		                                                                               parameters, width, scale);
	case PhysicalType::INT32:
		return VectorCastHelpers::TemplatedDecimalCast<int32_t, T, TryCastFromDecimal>(source, result, count,
		                                                                               parameters, width, scale);
	case PhysicalType::INT64:
		return VectorCastHelpers::TemplatedDecimalCast<int64_t, T, TryCastFromDecimal>(source, result, count,
		                                                                               parameters, width, scale);
	case PhysicalType::INT128:
		return VectorCastHelpers::TemplatedDecimalCast<hugeint_t, T, TryCastFromDecimal>(source, result, count,
		                                                                                 parameters, width, scale);
	default:
		throw InternalException("Unimplemented internal type for decimal");
	}
}